

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O2

void visceral_four(CHAR_DATA *ch)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  CHAR_DATA **ppCVar3;
  AFFECT_DATA af;
  
  if (ch->disrupted == false) {
    if (ch->fighting == (CHAR_DATA *)0x0) {
      act("Emerging from this loathsome orgy, $n and $s creatures surge with new strength.",ch,
          (void *)0x0,(void *)0x0,0);
      act("Emerging from this loathsome orgy, you feel new strength surge through you.",ch,
          (void *)0x0,(void *)0x0,3);
      init_affect(&af);
      af.where = 0;
      iVar2 = skill_lookup("visceral divination");
      af.type = (short)iVar2;
      af.aftype = 0;
      iVar2._0_2_ = ch->level;
      iVar2._2_2_ = ch->trust;
      af.duration = 0x3c;
      af.location = 0xd;
      af.end_fun = (AFF_FUN *)0x0;
      af.modifier = (short)(iVar2 << 3);
      af.owner = ch;
      af.level = (undefined2)iVar2;
      new_affect_to_char(ch,&af);
      af.location = 0;
      af.modifier = 0;
      new_affect_to_char(ch,&af);
      ppCVar3 = &ch->in_room->people;
      while (ch_00 = *ppCVar3, ch_00 != (CHAR_DATA *)0x0) {
        bVar1 = is_npc(ch_00);
        if (((bVar1) && (bVar1 = is_affected_by(ch_00,0x12), bVar1)) &&
           (ch_00->master == ch && ch_00->master != (CHAR_DATA *)0x0)) {
          af.location = 0x13;
          af.modifier = ch->level / 2 + -5;
          affect_to_char(ch_00,&af);
          act("$n\'s eyes glow with unholy fervor.",ch_00,(void *)0x0,(void *)0x0,0);
        }
        ppCVar3 = &ch_00->next_in_room;
      }
    }
    else {
      send_to_char("The unseen dark powers howl in fury at the disruption!\n\r",ch);
      send_to_char("Invisible claws rend at your flesh as they seek to sate their bloodthirst!\n\r",
                   ch);
      act("Swirling shadows surround $n, tearing at his flesh as $e shrieks in agony!",ch,
          (void *)0x0,(void *)0x0,0);
      iVar2 = dice(0x1e,0x28);
      damage_new(ch,ch,iVar2,(int)gsn_unholy_bond,0x13,true,false,0,1,"the unholy assault*");
    }
  }
  return;
}

Assistant:

void visceral_four(CHAR_DATA *ch)
{
	CHAR_DATA *mob;
	AFFECT_DATA af;

	if (ch->disrupted)
		return;

	if (ch->fighting)
	{
		send_to_char("The unseen dark powers howl in fury at the disruption!\n\r", ch);
		send_to_char("Invisible claws rend at your flesh as they seek to sate their bloodthirst!\n\r", ch);

		act("Swirling shadows surround $n, tearing at his flesh as $e shrieks in agony!", ch, nullptr, nullptr, TO_ROOM);

		damage_new(ch, ch, dice(30, 40), gsn_unholy_bond, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the unholy assault*");
		return;
	}

	act("Emerging from this loathsome orgy, $n and $s creatures surge with new strength.", ch, 0, 0, TO_ROOM);
	act("Emerging from this loathsome orgy, you feel new strength surge through you.", ch, 0, 0, TO_CHAR);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = skill_lookup("visceral divination");
	af.aftype = AFT_SPELL;
	af.level = ch->level;
	af.duration = 60;
	af.owner = ch;
	af.end_fun = nullptr;
	af.location = APPLY_HIT;
	af.modifier = ch->level * 8;
	new_affect_to_char(ch, &af);

	af.location = APPLY_NONE;
	af.modifier = 0;
	new_affect_to_char(ch, &af);

	for (mob = ch->in_room->people; mob != nullptr; mob = mob->next_in_room)
	{
		if (is_npc(mob) && is_affected_by(mob, AFF_CHARM) && mob->master && mob->master == ch)
		{
			af.location = APPLY_DAMROLL;
			af.modifier = (ch->level / 2) - 5;
			affect_to_char(mob, &af);
			act("$n's eyes glow with unholy fervor.", mob, 0, 0, TO_ROOM);
		}
	}
}